

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Design.cpp
# Opt level: O3

void __thiscall CDesign::SetState(CDesign *this,int iState)

{
  int *piVar1;
  uint uVar2;
  
  if (0xf < iState) {
    if (iState < 0x40) {
      if (iState == 0x10) {
        uVar2 = (this->super_CObject).m_iState & 0xffffffebU | 0x10;
        goto LAB_00108e52;
      }
      if (iState == 0x20) {
        piVar1 = &(this->super_CObject).m_iState;
        *(byte *)piVar1 = (byte)*piVar1 | 0x20;
        CObject::Display(0,"routing success!\n");
        return;
      }
    }
    else {
      if (iState == 0x40) {
        piVar1 = &(this->super_CObject).m_iState;
        *(byte *)piVar1 = (byte)*piVar1 | 0x40;
        return;
      }
      if (iState == 0x80) {
        piVar1 = &(this->super_CObject).m_iState;
        *(byte *)piVar1 = (byte)*piVar1 | 0x80;
        return;
      }
    }
    goto switchD_00108ddd_caseD_1;
  }
  switch(iState) {
  case 1:
    piVar1 = &(this->super_CObject).m_iState;
    *(byte *)piVar1 = (byte)*piVar1 | 1;
    return;
  case 2:
    uVar2 = (this->super_CObject).m_iState & 0xfffffff5U | 2;
    break;
  case 4:
    uVar2 = (this->super_CObject).m_iState & 0xffffffebU | 4;
    break;
  case 8:
    uVar2 = (this->super_CObject).m_iState & 0xfffffff5U | 8;
    break;
  case -2:
    piVar1 = &(this->super_CObject).m_iState;
    *(byte *)piVar1 = (byte)*piVar1 & 0xfe;
    return;
  default:
    if (iState == -0x41) {
      piVar1 = &(this->super_CObject).m_iState;
      *(byte *)piVar1 = (byte)*piVar1 & 0xbf;
      return;
    }
  case -1:
  case 0:
  case 3:
  case 5:
  case 6:
  case 7:
switchD_00108ddd_caseD_1:
    __assert_fail("FALSE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                  ,0x71e,"void CDesign::SetState(int)");
  }
LAB_00108e52:
  (this->super_CObject).m_iState = uVar2;
  return;
}

Assistant:

void CDesign::SetState(int iState)
{
	switch(iState){
	//case STATE_DESN_CONVERGING:
	//	m_iState	|=	STATE_DESN_CONVERGING;
	//	break;
	case STATE_DESN_COMPLETED:
		m_iState	|=	STATE_DESN_COMPLETED;
		break;
	case STATE_DESN_STUCK:
		m_iState	|=	STATE_DESN_STUCK;
		break;
	case ~STATE_DESN_STUCK:
		m_iState	&=	~STATE_DESN_STUCK;
		break;
	case STATE_DESN_SUCCESS:
		m_iState	|=	STATE_DESN_SUCCESS;
		//m_iState	&=	~STATE_DESN_STUCK;
		Display(DISPLAY_MODE_INFO,"routing success!\n");
		break;
	case STATE_DESN_REROUTING:	//design is being rerouted
		m_iState	&=	~STATE_DESN_REROUTED;
		m_iState	|=	STATE_DESN_REROUTING;
		break;
	case STATE_DESN_REROUTED:	//design is rerouted
		m_iState	|=	STATE_DESN_REROUTED;
		m_iState	&=	~STATE_DESN_REROUTING;
		break;
	case STATE_DESN_ROUTING:	//design is being routed
		m_iState	|=	STATE_DESN_ROUTING;
		m_iState	&=	~STATE_DESN_ROUTED;
		break;
	case STATE_DESN_OVERFLOW:	//design has overflow
		m_iState	|=	STATE_DESN_OVERFLOW;
		break;
	case ~STATE_DESN_OVERFLOW:	//the overflow in the design is removed
		m_iState	&=	~STATE_DESN_OVERFLOW;
		break;
	case STATE_DESN_ROUTED:		//design is routed
		m_iState	|=	STATE_DESN_ROUTED;
		m_iState	&=	~STATE_DESN_ROUTING;
		break;
	default:
		assert(FALSE);
		break;
	}
}